

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O3

IMeshSceneNode * __thiscall
irr::scene::CSceneManager::addMeshSceneNode
          (CSceneManager *this,IMesh *mesh,ISceneNode *parent,s32 id,vector3df *position,
          vector3df *rotation,vector3df *scale,bool alsoAddIfMeshPointerZero)

{
  int *piVar1;
  long lVar2;
  CMeshSceneNode *this_00;
  ISceneNode *parent_00;
  
  if (mesh == (IMesh *)0x0 && !alsoAddIfMeshPointerZero) {
    this_00 = (CMeshSceneNode *)0x0;
  }
  else {
    parent_00 = (ISceneNode *)&(this->super_ISceneManager).field_0x8;
    if (parent != (ISceneNode *)0x0) {
      parent_00 = parent;
    }
    this_00 = (CMeshSceneNode *)operator_new(0x1f8);
    CMeshSceneNode::CMeshSceneNode
              (this_00,mesh,parent_00,&this->super_ISceneManager,id,position,rotation,scale);
    lVar2 = *(long *)(*(long *)this_00 + -0x18);
    piVar1 = (int *)(&this_00->field_0x10 + lVar2);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (**(code **)(*(long *)(&this_00->field_0x0 + lVar2) + 8))();
    }
  }
  return (IMeshSceneNode *)this_00;
}

Assistant:

IMeshSceneNode *CSceneManager::addMeshSceneNode(IMesh *mesh, ISceneNode *parent, s32 id,
		const core::vector3df &position, const core::vector3df &rotation,
		const core::vector3df &scale, bool alsoAddIfMeshPointerZero)
{
	if (!alsoAddIfMeshPointerZero && !mesh)
		return 0;

	if (!parent)
		parent = this;

	IMeshSceneNode *node = new CMeshSceneNode(mesh, parent, this, id, position, rotation, scale);
	node->drop();

	return node;
}